

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * getrawaddrman(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffefb8;
  vector<RPCResult,_std::allocator<RPCResult>_> *this;
  allocator<RPCResult> *this_00;
  RPCResult *this_01;
  anon_class_1_0_00000001 *in_stack_ffffffffffffefc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefd0;
  undefined1 in_stack_ffffffffffffefe7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeff0;
  allocator<char> *in_stack_ffffffffffffeff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffff008;
  undefined1 in_stack_fffffffffffff00f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff010;
  undefined7 in_stack_fffffffffffff018;
  undefined1 in_stack_fffffffffffff01f;
  undefined7 in_stack_fffffffffffff020;
  undefined1 in_stack_fffffffffffff027;
  string *in_stack_fffffffffffff028;
  undefined4 in_stack_fffffffffffff030;
  Type in_stack_fffffffffffff034;
  undefined4 in_stack_fffffffffffff038;
  Type in_stack_fffffffffffff03c;
  RPCResult *in_stack_fffffffffffff040;
  undefined1 *local_fa8;
  undefined1 *local_f90;
  undefined1 *local_f78;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_02;
  undefined5 in_stack_fffffffffffff220;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 local_d70 [34];
  allocator<char> local_d4e;
  allocator<char> local_d4d;
  allocator<char> local_d4c [4];
  pointer local_d48;
  pointer pRStack_d40;
  pointer local_d38;
  allocator<char> local_d2a;
  allocator<char> local_d29;
  _Alloc_hider local_d28;
  size_type sStack_d20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d18 [2];
  undefined1 local_ce9 [9];
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined1 local_cca;
  undefined1 local_cc9 [9];
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  allocator<char> local_ca9;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  allocator<char> local_c8a;
  allocator<char> local_c89;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  allocator<char> local_c49;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  allocator<char> local_c2a;
  allocator<char> local_c29;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  allocator<char> local_c0a;
  allocator<char> local_c09;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  allocator<char> local_be2;
  allocator<char> local_be1 [31];
  allocator<char> local_bc2;
  allocator<char> local_bc1 [31];
  allocator<char> local_ba2;
  allocator<char> local_ba1 [31];
  allocator<char> local_b82;
  allocator<char> local_b81 [25];
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  allocator<char> local_b4a;
  allocator<char> local_b49 [993];
  undefined1 local_768 [816];
  string local_438 [12];
  undefined1 local_2a0 [64];
  undefined1 local_260 [136];
  undefined1 local_1d8 [64];
  undefined1 local_198 [136];
  undefined1 local_110 [264];
  long local_8;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  local_b68 = 0;
  uStack_b60 = 0;
  local_b58 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(in_stack_ffffffffffffefb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  local_c08 = 0;
  uStack_c00 = 0;
  local_bf8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefb8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  local_c28 = 0;
  uStack_c20 = 0;
  local_c18 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefb8);
  this = (vector<RPCResult,_std::allocator<RPCResult>_> *)
         ((ulong)in_stack_ffffffffffffefb8 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
             in_stack_fffffffffffff034,in_stack_fffffffffffff028,(bool)in_stack_fffffffffffff027,
             (string *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018),
             in_stack_fffffffffffff010,(bool)in_stack_fffffffffffff00f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  local_c48 = 0;
  uStack_c40 = 0;
  local_c38 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  GetNetworkNames_abi_cxx11_((bool)in_stack_ffffffffffffefe7);
  util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffefd0,(char (*) [3])in_stack_ffffffffffffefc8);
  std::operator+((char *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  std::operator+(in_stack_ffffffffffffefd0,(char *)in_stack_ffffffffffffefc8);
  local_c88 = 0;
  uStack_c80 = 0;
  local_c78 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  local_ca8 = 0;
  uStack_ca0 = 0;
  local_c98 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),__rhs);
  std::operator+(in_stack_ffffffffffffefd0,(char *)in_stack_ffffffffffffefc8);
  local_cc9._1_8_ = 0;
  uStack_cc0 = 0;
  local_cb8 = 0;
  this_02 = (RPCHelpMan *)(local_cc9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  description = local_438;
  name = (string *)local_cc9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_cca;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  local_ce9._1_8_ = 0;
  uStack_ce0 = 0;
  local_cd8 = 0;
  results = (RPCResults *)(local_ce9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  examples = (RPCExamples *)local_ce9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  GetNetworkNames_abi_cxx11_((bool)in_stack_ffffffffffffefe7);
  util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffefd0,(char (*) [3])in_stack_ffffffffffffefc8);
  std::operator+((char *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  std::operator+(in_stack_ffffffffffffefd0,(char *)in_stack_ffffffffffffefc8);
  local_d28._M_p = (pointer)0x0;
  sStack_d20 = 0;
  local_d18[0]._M_allocated_capacity = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  local_d48 = (pointer)0x0;
  pRStack_d40 = (pointer)0x0;
  local_d38 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  this_00 = (allocator<RPCResult> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
             in_stack_fffffffffffff034,in_stack_fffffffffffff028,(bool)in_stack_fffffffffffff027,
             (string *)CONCAT17(in_stack_fffffffffffff01f,in_stack_fffffffffffff018),
             in_stack_fffffffffffff010,(bool)in_stack_fffffffffffff00f);
  uVar3 = 0;
  std::allocator<RPCResult>::allocator(this_00);
  __l._M_len._0_7_ = in_stack_fffffffffffff008;
  __l._M_array = (iterator)__rhs;
  __l._M_len._7_1_ = in_stack_fffffffffffff00f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeff8,__l,
             (allocator_type *)in_stack_ffffffffffffeff0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  uVar2 = 0;
  std::allocator<RPCResult>::allocator(this_00);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff008;
  __l_00._M_array = (iterator)__rhs;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff00f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeff8,__l_00,
             (allocator_type *)in_stack_ffffffffffffeff0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  uVar1 = 0;
  std::allocator<RPCResult>::allocator(this_00);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff008;
  __l_01._M_array = (iterator)__rhs;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff00f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeff8,__l_01,
             (allocator_type *)in_stack_ffffffffffffeff0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff040,in_stack_fffffffffffff03c,
             (string *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
             in_stack_fffffffffffff028,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
             (bool)in_stack_fffffffffffff01f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  HelpExampleCli(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff00f,in_stack_fffffffffffff008),(char *)__rhs,
             in_stack_ffffffffffffeff8);
  HelpExampleRpc(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  std::operator+(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x656d9e);
  this_01 = (RPCResult *)local_d70;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getrawaddrman()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0);
  RPCHelpMan::RPCHelpMan
            (this_02,name,description,args,results,examples,
             (RPCMethodImpl *)
             CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,in_stack_fffffffffffff220))));
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)(local_d70 + 0x21));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_d4e);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_d4d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_d4c);
  RPCResults::~RPCResults((RPCResults *)this_01);
  RPCResult::~RPCResult(this_01);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_f78 = local_110;
  do {
    local_f78 = local_f78 + -0x88;
    RPCResult::~RPCResult(this_01);
  } while (local_f78 != local_198);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_f90 = local_1d8;
  do {
    local_f90 = local_f90 + -0x88;
    RPCResult::~RPCResult(this_01);
  } while (local_f90 != local_260);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_fa8 = local_2a0;
  do {
    local_fa8 = local_fa8 + -0x88;
    RPCResult::~RPCResult(this_01);
  } while (local_fa8 != local_768);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_d2a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_d29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)local_ce9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)&local_cca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator((allocator<char> *)local_cc9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_ca9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_c8a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_c89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_c49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_c2a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_c29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_c0a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_c09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_be2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_be1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_bc2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_bc1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_ba2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_ba1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_b82);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_b81);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffefc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(&local_b4a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::allocator<char>::~allocator(local_b49);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrawaddrman()
{
    return RPCHelpMan{"getrawaddrman",
        "EXPERIMENTAL warning: this call may be changed in future releases.\n"
        "\nReturns information on all address manager entries for the new and tried tables.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ_DYN, "", "", {
                {RPCResult::Type::OBJ_DYN, "table", "buckets with addresses in the address manager table ( new, tried )", {
                    {RPCResult::Type::OBJ, "bucket/position", "the location in the address manager table (<bucket>/<position>)", {
                        {RPCResult::Type::STR, "address", "The address of the node"},
                        {RPCResult::Type::NUM, "mapped_as", /*optional=*/true, "The ASN mapped to the IP of this peer per our current ASMap"},
                        {RPCResult::Type::NUM, "port", "The port number of the node"},
                        {RPCResult::Type::STR, "network", "The network (" + Join(GetNetworkNames(), ", ") + ") of the address"},
                        {RPCResult::Type::NUM, "services", "The services offered by the node"},
                        {RPCResult::Type::NUM_TIME, "time", "The " + UNIX_EPOCH_TIME + " when the node was last seen"},
                        {RPCResult::Type::STR, "source", "The address that relayed the address to us"},
                        {RPCResult::Type::STR, "source_network", "The network (" + Join(GetNetworkNames(), ", ") + ") of the source address"},
                        {RPCResult::Type::NUM, "source_mapped_as", /*optional=*/true, "The ASN mapped to the IP of this peer's source per our current ASMap"}
                    }}
                }}
            }
        },
        RPCExamples{
            HelpExampleCli("getrawaddrman", "")
            + HelpExampleRpc("getrawaddrman", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            AddrMan& addrman = EnsureAnyAddrman(request.context);
            NodeContext& node_context = EnsureAnyNodeContext(request.context);
            CConnman& connman = EnsureConnman(node_context);

            UniValue ret(UniValue::VOBJ);
            ret.pushKV("new", AddrmanTableToJSON(addrman.GetEntries(false), connman));
            ret.pushKV("tried", AddrmanTableToJSON(addrman.GetEntries(true), connman));
            return ret;
        },
    };
}